

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLVisualSceneLoader.cpp
# Opt level: O3

UniqueId * __thiscall COLLADASaxFWL::VisualSceneLoader::getUniqueId(VisualSceneLoader *this)

{
  int iVar1;
  _Elt_pointer ppNVar2;
  Node *pNVar3;
  undefined4 extraout_var;
  
  pNVar3 = (Node *)(this->super_NodeLoader).mCurrentInstanceController;
  if ((pNVar3 == (Node *)0x0) &&
     (pNVar3 = (Node *)(this->super_NodeLoader).mCurrentInstanceGeometry, pNVar3 == (Node *)0x0)) {
    ppNVar2 = (this->super_NodeLoader).mNodeStack.c.
              super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppNVar2 ==
        (this->super_NodeLoader).mNodeStack.c.
        super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      pNVar3 = (Node *)this->mVisualScene;
      if (pNVar3 == (Node *)0x0) {
        return (UniqueId *)COLLADAFW::UniqueId::INVALID;
      }
    }
    else {
      if (ppNVar2 ==
          (this->super_NodeLoader).mNodeStack.c.
          super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppNVar2 = (this->super_NodeLoader).mNodeStack.c.
                  super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      pNVar3 = ppNVar2[-1];
    }
  }
  iVar1 = (*(((InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)431> *)
             &pNVar3->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)424>)->
            super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)431>).super_Object._vptr_Object
            [3])(pNVar3);
  return (UniqueId *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const COLLADAFW::UniqueId& VisualSceneLoader::getUniqueId()
    {
        if ( mCurrentInstanceController )
		{
			return mCurrentInstanceController->getUniqueId();
		}
        else if ( mCurrentInstanceGeometry )
		{
			return mCurrentInstanceGeometry->getUniqueId();
		}

		if ( !mNodeStack.empty() )
		{
			COLLADAFW::Node* currentNode = mNodeStack.top();
			return currentNode->getUniqueId();
		}

        if ( mVisualScene )
		{
			return mVisualScene->getUniqueId();
		}

        return COLLADAFW::UniqueId::INVALID;
    }